

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O2

FUDMFKey * __thiscall FUDMFKey::operator=(FUDMFKey *this,double val)

{
  this->Type = 1;
  this->IntVal = (int)val;
  this->FloatVal = val;
  FString::operator=(&this->StringVal,(char *)"");
  return this;
}

Assistant:

FUDMFKey& operator =(double val)
	{
		Type = UDMF_Float;
		IntVal = int(val);
		FloatVal = val;
		StringVal = "";
		return *this;
	}